

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

uint __thiscall ON_PolyCurve::SizeOf(ON_PolyCurve *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ON_Curve **ppOVar6;
  ON_Curve *crv;
  int local_18;
  int count;
  int i;
  uint sz;
  ON_PolyCurve *this_local;
  
  uVar1 = ON_Curve::SizeOf(&this->super_ON_Curve);
  uVar2 = ON_SimpleArray<double>::SizeOfArray(&this->m_t);
  uVar3 = ON_SimpleArray<ON_Curve_*>::SizeOfArray
                    (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
  count = uVar3 + uVar2 + uVar1 + 0x30;
  iVar4 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
  for (local_18 = 0; local_18 < iVar4; local_18 = local_18 + 1) {
    ppOVar6 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_18);
    if (*ppOVar6 != (ON_Curve *)0x0) {
      iVar5 = (*((*ppOVar6)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[8])();
      count = iVar5 + count;
    }
  }
  return count;
}

Assistant:

unsigned int ON_PolyCurve::SizeOf() const
{
  unsigned int sz = ON_Curve::SizeOf();
  sz += (sizeof(*this) - sizeof(ON_Curve));
  sz += m_t.SizeOfArray();
  sz += m_segment.SizeOfArray();
  int i, count = m_segment.Count();
  for ( i = 0; i < count; i++ )
  {
    const ON_Curve* crv = m_segment[i];
    if ( crv )
      sz += crv->SizeOf();
  }
  return sz;
}